

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

bool __thiscall
TPathFragmentTable::CompareAndCopyPathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TGenericArray<char> *this_00;
  TSparseArray *this_01;
  char *pcVar1;
  char cVar2;
  TStruct40 *pTVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  pTVar3 = pSearch->pStruct40;
  this_00 = &pTVar3->PathBuffer;
  if ((this->PathMarks).TotalItemCount == 0) {
    uVar6 = pTVar3->PathLength;
    do {
      uVar7 = (ulong)(this->PathFragments).ItemCount;
      if (pSearch->cchSearchMask <= (ulong)uVar6) {
        if (nFragmentOffset < uVar7) {
          do {
            cVar2 = (this->PathFragments).ItemArray[nFragmentOffset];
            if (cVar2 == '\0') {
              return true;
            }
            TGenericArray<char>::Insert(this_00,cVar2);
            nFragmentOffset = nFragmentOffset + 1;
          } while (nFragmentOffset < (this->PathFragments).ItemCount);
        }
        goto LAB_00117574;
      }
      if (uVar7 <= nFragmentOffset) goto LAB_00117574;
      cVar2 = (this->PathFragments).ItemArray[nFragmentOffset];
      bVar8 = cVar2 == pSearch->szSearchMask[uVar6];
      if (!bVar8) {
        return bVar8;
      }
      TGenericArray<char>::Insert(this_00,cVar2);
      uVar6 = pTVar3->PathLength + 1;
      pTVar3->PathLength = uVar6;
      if ((ulong)(this->PathFragments).ItemCount <= nFragmentOffset + 1) goto LAB_00117574;
      lVar4 = nFragmentOffset + 1;
      nFragmentOffset = nFragmentOffset + 1;
    } while ((this->PathFragments).ItemArray[lVar4] != '\0');
  }
  else {
    this_01 = &this->PathMarks;
    do {
      if (pSearch->cchSearchMask <= nFragmentOffset) {
        bVar8 = TSparseArray::IsItemPresent(this_01,nFragmentOffset);
        while( true ) {
          if (bVar8 != false) {
            return true;
          }
          if ((this->PathFragments).ItemCount <= nFragmentOffset) break;
          pcVar1 = (this->PathFragments).ItemArray + nFragmentOffset;
          nFragmentOffset = nFragmentOffset + 1;
          TGenericArray<char>::Insert(this_00,*pcVar1);
          bVar8 = TSparseArray::IsItemPresent(this_01,nFragmentOffset);
        }
LAB_00117574:
        __assert_fail("index < ItemCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                      ,0x1d0,"T &TGenericArray<char>::operator[](size_t) [T = char]");
      }
      if ((this->PathFragments).ItemCount <= nFragmentOffset) goto LAB_00117574;
      cVar2 = (this->PathFragments).ItemArray[nFragmentOffset];
      bVar8 = cVar2 == pSearch->szSearchMask[pTVar3->PathLength];
      if (!bVar8) {
        return bVar8;
      }
      TGenericArray<char>::Insert(this_00,cVar2);
      pTVar3->PathLength = pTVar3->PathLength + 1;
      bVar5 = TSparseArray::IsItemPresent(this_01,nFragmentOffset);
      nFragmentOffset = nFragmentOffset + 1;
    } while (!bVar5);
  }
  return bVar8;
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if(PathMarks.IsEmpty())
        {
            // Keep copying as long as we don't reach the end of the search mask
            while(pStruct40->PathLength < pSearch->cchSearchMask)
            {
                // HOTS: 195A5A0
                if(PathFragments[nFragmentOffset] != pSearch->szSearchMask[pStruct40->PathLength])
                    return false;

                // HOTS: 195A5B7
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
                pStruct40->PathLength++;

                // If we found the end of the fragment, return success
                if(PathFragments[nFragmentOffset] == 0)
                    return true;
            }

            // HOTS: 195A660
            // Now we need to copy the rest of the fragment
            while(PathFragments[nFragmentOffset] != 0)
            {
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset]);
                nFragmentOffset++;
            }
        }
        else
        {
            // Keep copying as long as we don't reach the end of the search mask
            while(nFragmentOffset < pSearch->cchSearchMask)
            {
                if(PathFragments[nFragmentOffset] != pSearch->szSearchMask[pStruct40->PathLength])
                    return false;

                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset]);
                pStruct40->PathLength++;

                // If we found the end of the fragment, return success
                if(PathMarks.IsItemPresent(nFragmentOffset++))
                    return true;
            }

            // Now we need to copy the rest of the fragment
            while(!PathMarks.IsItemPresent(nFragmentOffset))
            {
                // HOTS: 195A7A6
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }

        return true;
    }